

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sample_server.cpp
# Opt level: O2

InitializeResult * __thiscall
lscpp::my_lsp_server::initialize
          (InitializeResult *__return_storage_ptr__,my_lsp_server *this,InitializeParams *params)

{
  CompletionOptions local_c0;
  _Storage<lscpp::protocol::TextDocumentSyncOptions,_true> local_a0;
  char local_94;
  undefined2 local_90;
  optional<lscpp::protocol::CompletionOptions> local_88 [2];
  undefined1 local_28;
  
  local_94 = '\0';
  local_88[0].super__Optional_base<lscpp::protocol::CompletionOptions,_false,_false>._M_payload.
  super__Optional_payload<lscpp::protocol::CompletionOptions,_true,_false,_false>.
  super__Optional_payload_base<lscpp::protocol::CompletionOptions>._M_engaged = false;
  local_28 = 0;
  local_90 = 1;
  local_c0.resolveProvider = false;
  local_c0.triggerCharacters.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_c0.triggerCharacters.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_c0.triggerCharacters.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::optional<lscpp::protocol::CompletionOptions>::operator=(local_88,&local_c0);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_c0.triggerCharacters);
  local_90 = CONCAT11(1,(undefined1)local_90);
  local_a0._M_value.openClose = true;
  local_a0._M_value.change = Full;
  local_a0._8_2_ = 0;
  local_a0._M_value.save.super__Optional_base<lscpp::protocol::SaveOptions,_true,_true>._M_payload.
  super__Optional_payload_base<lscpp::protocol::SaveOptions>._M_engaged = false;
  if (local_94 == '\0') {
    local_94 = '\x01';
  }
  protocol::ServerCapabilities::ServerCapabilities
            (&__return_storage_ptr__->capabilities,(ServerCapabilities *)&local_a0._M_value);
  protocol::ServerCapabilities::~ServerCapabilities((ServerCapabilities *)&local_a0._M_value);
  return __return_storage_ptr__;
}

Assistant:

protocol::InitializeResult
  initialize(const protocol::InitializeParams &params) override {
    protocol::ServerCapabilities capabilites;
    capabilites.hoverProvider = true;
    capabilites.completionProvider = protocol::CompletionOptions{};
    capabilites.definitionProvider = true;
    protocol::TextDocumentSyncOptions sync;
    sync.openClose = true;
    sync.change = protocol::TextDocumentSyncKind::Full;
    capabilites.textDocumentSync = sync;
    protocol::InitializeResult result{capabilites};
    return result;
  }